

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  int *val;
  mbedtls_x509_sequence *pmVar1;
  mbedtls_x509_sequence *cur;
  size_t __n;
  int iVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_x509_crt *pmVar4;
  uchar *__dest;
  size_t sVar5;
  ulong uVar6;
  mbedtls_x509_crt *pmVar7;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *local_138;
  mbedtls_x509_crt *local_130;
  byte *local_128;
  int local_11c;
  int *local_118;
  size_t len;
  mbedtls_x509_sequence *local_108;
  uint local_100;
  int is_critical;
  size_t len_2;
  uchar uStack_f0;
  undefined7 uStack_ef;
  byte *local_e8;
  int *local_d8;
  byte *local_d0;
  size_t len_1;
  size_t local_c0;
  mbedtls_x509_buf extn_oid;
  mbedtls_x509_buf sig_params1;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf sig_params2;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar3 = (mbedtls_x509_crt *)0x0;
  pmVar4 = chain;
  do {
    pmVar7 = pmVar4;
    if (pmVar7->version == 0) goto LAB_0010d994;
    pmVar3 = pmVar7;
    pmVar4 = pmVar7->next;
  } while (pmVar7->next != (mbedtls_x509_crt *)0x0);
  pmVar4 = (mbedtls_x509_crt *)calloc(1,0x228);
  pmVar7->next = pmVar4;
  if (pmVar4 == (mbedtls_x509_crt *)0x0) {
    return -0x2880;
  }
  memset(pmVar4,0,0x228);
  pmVar7 = pmVar7->next;
LAB_0010d994:
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  sig_params1.p = (uchar *)0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  sig_params2.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  if (pmVar7 == (mbedtls_x509_crt *)0x0) {
    iVar2 = -0x2800;
    goto LAB_0010db90;
  }
  local_138 = buf;
  len = buflen;
  iVar2 = mbedtls_asn1_get_tag(&local_138,buf + buflen,&len,0x30);
  sVar5 = len;
  if (iVar2 != 0) {
    mbedtls_x509_crt_free(pmVar7);
    iVar2 = -0x2180;
    goto LAB_0010db90;
  }
  local_130 = pmVar7;
  if ((ulong)((long)(buf + buflen) - (long)local_138) < len) goto LAB_0010da23;
  pbVar10 = local_138 + (len - (long)buf);
  (pmVar7->raw).len = (size_t)pbVar10;
  __dest = (uchar *)calloc(1,(size_t)pbVar10);
  (pmVar7->raw).p = __dest;
  if (__dest == (uchar *)0x0) {
    iVar2 = -0x2880;
    goto LAB_0010db90;
  }
  memcpy(__dest,buf,(size_t)pbVar10);
  local_138 = __dest + ((long)pbVar10 - sVar5);
  (pmVar7->tbs).p = local_138;
  iVar2 = mbedtls_asn1_get_tag(&local_138,__dest + (long)pbVar10,&len,0x30);
  if (iVar2 != 0) {
LAB_0010daaa:
    mbedtls_x509_crt_free(pmVar7);
    iVar2 = iVar2 + -0x2180;
    if (iVar2 == 0) {
      return 0;
    }
    goto LAB_0010db90;
  }
  pbVar9 = local_138 + len;
  (pmVar7->tbs).len = (long)pbVar9 - (long)(pmVar7->tbs).p;
  val = &pmVar7->version;
  local_d0 = __dest + (long)pbVar10;
  iVar2 = mbedtls_asn1_get_tag(&local_138,pbVar9,&len_2,0xa0);
  if (iVar2 == 0) {
    pbVar10 = local_138 + len_2;
    local_128 = pbVar9;
    iVar2 = mbedtls_asn1_get_int(&local_138,pbVar10,val);
    pbVar9 = local_128;
    if (iVar2 != 0) {
      iVar2 = iVar2 + -0x2200;
      goto LAB_0010db4a;
    }
    if (local_138 == pbVar10) goto LAB_0010db4f;
    iVar2 = -0x2266;
  }
  else {
    if (iVar2 == -0x62) {
      *val = 0;
    }
    else {
LAB_0010db4a:
      if (iVar2 != 0) goto LAB_0010db88;
    }
LAB_0010db4f:
    iVar2 = mbedtls_x509_get_serial(&local_138,pbVar9,&pmVar7->serial);
    if (iVar2 == 0) {
      local_118 = val;
      iVar2 = mbedtls_x509_get_alg(&local_138,pbVar9,&pmVar7->sig_oid,&sig_params1);
      if (iVar2 == 0) {
        local_128 = pbVar9;
        if (2 < (uint)*local_118) {
          mbedtls_x509_crt_free(pmVar7);
          iVar2 = -0x2580;
          goto LAB_0010db90;
        }
        pmVar7->version = *local_118 + 1;
        iVar2 = mbedtls_x509_get_sig_alg
                          (&pmVar7->sig_oid,&sig_params1,&pmVar7->sig_md,&pmVar7->sig_pk,
                           &pmVar7->sig_opts);
        if (iVar2 == 0) {
          (pmVar7->issuer_raw).p = local_138;
          iVar2 = mbedtls_asn1_get_tag(&local_138,local_128,&len,0x30);
          if (iVar2 != 0) goto LAB_0010daaa;
          iVar2 = mbedtls_x509_get_name(&local_138,local_138 + len,&pmVar7->issuer);
          if (iVar2 == 0) {
            (pmVar7->issuer_raw).len = (long)local_138 - (long)(pmVar7->issuer_raw).p;
            iVar2 = mbedtls_asn1_get_tag(&local_138,local_128,&len_2,0x30);
            if (iVar2 == 0) {
              pbVar10 = local_138 + len_2;
              iVar2 = mbedtls_x509_get_time(&local_138,pbVar10,&local_130->valid_from);
              pmVar7 = local_130;
              if (((iVar2 == 0) &&
                  (iVar2 = mbedtls_x509_get_time(&local_138,pbVar10,&local_130->valid_to),
                  pmVar7 = local_130, iVar2 == 0)) && (iVar2 = -0x2466, local_138 == pbVar10))
              goto LAB_0010dca0;
            }
            else {
              iVar2 = iVar2 + -0x2400;
              pmVar7 = local_130;
              if (iVar2 == 0) {
LAB_0010dca0:
                (local_130->subject_raw).p = local_138;
                iVar2 = mbedtls_asn1_get_tag(&local_138,local_128,&len,0x30);
                pmVar7 = local_130;
                if (iVar2 != 0) goto LAB_0010daaa;
                if ((len == 0) ||
                   (iVar2 = mbedtls_x509_get_name(&local_138,local_138 + len,&local_130->subject),
                   pmVar7 = local_130, iVar2 == 0)) {
                  (local_130->subject_raw).len = (long)local_138 - (long)(local_130->subject_raw).p;
                  iVar2 = mbedtls_pk_parse_subpubkey(&local_138,local_128,&local_130->pk);
                  pmVar7 = local_130;
                  if (iVar2 == 0) {
                    uVar8 = *local_118;
                    if ((uVar8 & 0xfffffffe) == 2) {
                      iVar2 = x509_get_uid(&local_138,local_128,&local_130->issuer_id,1);
                      pmVar7 = local_130;
                      if (iVar2 != 0) goto LAB_0010db88;
                      uVar8 = *local_118;
                    }
                    if ((uVar8 & 0xfffffffe) == 2) {
                      iVar2 = x509_get_uid(&local_138,local_128,&local_130->subject_id,2);
                      pmVar7 = local_130;
                      if (iVar2 != 0) goto LAB_0010db88;
                      if ((*local_118 == 3) &&
                         (iVar2 = mbedtls_x509_get_ext(&local_138,local_128,&local_130->v3_ext,3),
                         pmVar4 = local_130, iVar2 != -0x62)) {
                        if (iVar2 == 0) {
                          pmVar1 = &local_130->subject_alt_names;
                          cur = &local_130->ext_key_usage;
                          local_118 = &local_130->ca_istrue;
                          local_d8 = &local_130->max_pathlen;
LAB_0010de64:
                          if (local_128 <= local_138) {
                            if (local_138 == local_128) goto LAB_0010e30e;
                            iVar2 = -0x2566;
                            pmVar7 = local_130;
                            goto LAB_0010db88;
                          }
                          extn_oid.p = (uchar *)0x0;
                          is_critical = 0;
                          extn_oid.tag = 0;
                          extn_oid._4_4_ = 0;
                          extn_oid.len = 0;
                          local_100 = 0;
                          iVar2 = mbedtls_asn1_get_tag(&local_138,local_128,&len_1,0x30);
                          if (iVar2 != 0) {
LAB_0010e2c0:
                            iVar2 = iVar2 + -0x2500;
                            goto LAB_0010e305;
                          }
                          pbVar10 = local_138 + len_1;
                          extn_oid.tag = (uint)*local_138;
                          iVar2 = mbedtls_asn1_get_tag(&local_138,local_128,&extn_oid.len,6);
                          if (iVar2 != 0) goto LAB_0010e2c0;
                          extn_oid.p = local_138;
                          local_138 = local_138 + extn_oid.len;
                          if (local_128 == local_138 || (long)local_128 - (long)local_138 < 0) {
                            iVar2 = -0x2560;
                            goto LAB_0010e305;
                          }
                          iVar2 = mbedtls_asn1_get_bool(&local_138,pbVar10,&is_critical);
                          if (((iVar2 != -0x62) && (iVar2 != 0)) ||
                             (iVar2 = mbedtls_asn1_get_tag(&local_138,pbVar10,&len_1,4), iVar2 != 0)
                             ) goto LAB_0010e2c0;
                          pbVar9 = local_138 + len_1;
                          iVar2 = -0x2566;
                          if (pbVar9 != pbVar10) goto LAB_0010e305;
                          iVar2 = mbedtls_oid_get_x509_ext_type(&extn_oid,(int *)&local_100);
                          if (iVar2 != 0) {
                            local_138 = pbVar9;
                            if (is_critical != 0) {
                              iVar2 = -0x2562;
                              goto LAB_0010e305;
                            }
                            goto LAB_0010de64;
                          }
                          if ((local_100 & local_130->ext_types) != 0) {
                            iVar2 = -0x2500;
                            goto LAB_0010e305;
                          }
                          local_130->ext_types = local_130->ext_types | local_100;
                          if (local_100 == 4) {
                            len_2 = 0;
                            uStack_f0 = '\0';
                            uStack_ef = 0;
                            local_e8 = (byte *)0x0;
                            iVar2 = mbedtls_asn1_get_bitstring
                                              (&local_138,pbVar9,(mbedtls_asn1_bitstring *)&len_2);
                            if (iVar2 == 0) {
                              if (len_2 == 0) goto LAB_0010e3ec;
                              local_130->key_usage = 0;
                              sVar5 = len_2;
                              if (3 < len_2) {
                                sVar5 = 4;
                              }
                              uVar8 = 0;
                              pbVar10 = local_e8;
                              for (uVar6 = 0; (uint)((int)sVar5 << 3) != uVar6; uVar6 = uVar6 + 8) {
                                uVar8 = uVar8 | (uint)*pbVar10 << ((byte)uVar6 & 0x1f);
                                local_130->key_usage = uVar8;
                                pbVar10 = pbVar10 + 1;
                              }
                              goto LAB_0010de64;
                            }
                          }
                          else {
                            if (local_100 == 0x20) {
                              iVar2 = mbedtls_asn1_get_tag(&local_138,pbVar9,&len_2,0x30);
                              if (iVar2 != 0) goto LAB_0010e281;
                              local_11c = -0x2566;
                              iVar2 = local_11c;
                              if (local_138 + len_2 != pbVar10) goto LAB_0010e305;
                              local_108 = pmVar1;
                              if (local_138 < pbVar10) {
                                if (pbVar10 == local_138 || (long)pbVar10 - (long)local_138 < 0) {
                                  local_11c = -0x2560;
                                  iVar2 = local_11c;
                                }
                                else {
                                  local_138 = local_138 + 1;
                                  iVar2 = mbedtls_asn1_get_len(&local_138,pbVar9,&local_c0);
                                  if (iVar2 != 0) goto LAB_0010e281;
                                  local_11c = -0x2562;
                                  iVar2 = local_11c;
                                }
                                goto LAB_0010e305;
                              }
                              (pmVar4->subject_alt_names).next = (mbedtls_asn1_sequence *)0x0;
                              if (local_138 != pbVar10) goto LAB_0010e305;
                              goto LAB_0010de64;
                            }
                            if (local_100 == 0x10000) {
                              len_2 = 0;
                              uStack_f0 = '\0';
                              uStack_ef = 0;
                              local_e8 = (byte *)0x0;
                              iVar2 = mbedtls_asn1_get_bitstring
                                                (&local_138,pbVar9,(mbedtls_asn1_bitstring *)&len_2)
                              ;
                              if (iVar2 == 0) {
                                if (len_2 != 1) {
LAB_0010e3ec:
                                  iVar2 = -0x2564;
                                  goto LAB_0010e305;
                                }
                                local_130->ns_cert_type = *local_e8;
                                goto LAB_0010de64;
                              }
                            }
                            else if (local_100 == 0x800) {
                              iVar2 = mbedtls_asn1_get_sequence_of(&local_138,pbVar9,cur,6);
                              if (iVar2 == 0) {
                                if ((local_130->ext_key_usage).buf.p == (uchar *)0x0)
                                goto LAB_0010e3ec;
                                goto LAB_0010de64;
                              }
                            }
                            else {
                              if (local_100 != 0x100) {
                                iVar2 = -0x2080;
                                goto LAB_0010e305;
                              }
                              *local_118 = 0;
                              *local_d8 = 0;
                              iVar2 = mbedtls_asn1_get_tag(&local_138,pbVar9,&len_2,0x30);
                              if (iVar2 != 0) goto LAB_0010e281;
                              if (local_138 == pbVar10) goto LAB_0010de64;
                              iVar2 = mbedtls_asn1_get_bool(&local_138,pbVar9,local_118);
                              if (iVar2 != 0) {
                                if (iVar2 == -0x62) {
                                  iVar2 = mbedtls_asn1_get_int(&local_138,pbVar9,local_118);
                                }
                                if (iVar2 != 0) goto LAB_0010e281;
                                if (*local_118 != 0) {
                                  *local_118 = 1;
                                }
                              }
                              if (local_138 == pbVar10) goto LAB_0010de64;
                              iVar2 = mbedtls_asn1_get_int(&local_138,pbVar9,local_d8);
                              if (iVar2 == 0) {
                                if (local_138 != pbVar10) {
                                  iVar2 = -0x2566;
                                  goto LAB_0010e305;
                                }
                                *local_d8 = *local_d8 + 1;
                                goto LAB_0010de64;
                              }
                            }
                          }
LAB_0010e281:
                          iVar2 = iVar2 + -0x2500;
                          if (iVar2 != 0) goto LAB_0010e305;
                          goto LAB_0010de64;
                        }
LAB_0010e305:
                        pmVar7 = local_130;
                        if (iVar2 != 0) goto LAB_0010db88;
                      }
                    }
LAB_0010e30e:
                    if (local_138 != local_128) {
LAB_0010da23:
                      pmVar7 = local_130;
                      mbedtls_x509_crt_free(local_130);
                      iVar2 = -0x21e6;
                      goto LAB_0010db90;
                    }
                    iVar2 = mbedtls_x509_get_alg(&local_138,local_d0,&local_68,&sig_params2);
                    pmVar7 = local_130;
                    if (iVar2 == 0) {
                      __n = (local_130->sig_oid).len;
                      if (((__n != local_68.len) ||
                          (iVar2 = bcmp((local_130->sig_oid).p,local_68.p,__n), iVar2 != 0)) ||
                         ((sig_params1.len != sig_params2.len ||
                          ((sig_params1.len != 0 &&
                           (iVar2 = bcmp(sig_params1.p,sig_params2.p,sig_params1.len), iVar2 != 0)))
                          ))) {
                        pmVar7 = local_130;
                        mbedtls_x509_crt_free(local_130);
                        iVar2 = -0x2680;
                        goto LAB_0010db90;
                      }
                      iVar2 = mbedtls_x509_get_sig(&local_138,local_d0,&local_130->sig);
                      pmVar7 = local_130;
                      if (iVar2 == 0) {
                        if (local_138 == local_d0) {
                          return 0;
                        }
                        goto LAB_0010da23;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010db88:
  mbedtls_x509_crt_free(pmVar7);
LAB_0010db90:
  if (pmVar3 != (mbedtls_x509_crt *)0x0) {
    pmVar3->next = (mbedtls_x509_crt *)0x0;
  }
  if (pmVar7 != chain) {
    free(pmVar7);
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}